

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.cxx
# Opt level: O0

int __thiscall nuraft::peer::shutdown(peer *this,int __fd,int __how)

{
  int extraout_EAX;
  __shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2> *unaff_retaddr;
  lock_guard<std::mutex> l;
  lock_guard<std::mutex> *in_stack_fffffffffffffff0;
  
  std::atomic<bool>::operator=
            ((atomic<bool> *)in_stack_fffffffffffffff0,SUB81((ulong)this >> 0x38,0));
  std::__shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2> *)
             unaff_retaddr);
  std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffff0,(mutex_type *)this);
  std::__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2> *)unaff_retaddr);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x140739);
  std::__shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>::reset(unaff_retaddr);
  return extraout_EAX;
}

Assistant:

void peer::shutdown() {
    // Should set the flag to block all incoming requests.
    abandoned_ = true;

    // Cut off all shared pointers related to ASIO and Raft server.
    scheduler_.reset();
    {   // To guarantee atomic reset
        // (race between send_req()).
        std::lock_guard<std::mutex> l(rpc_protector_);
        rpc_.reset();
    }
    hb_task_.reset();
}